

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

int run_test_ipc_listen_after_write(void)

{
  int extraout_EAX;
  int iVar1;
  uv_handle_type uVar2;
  int extraout_EAX_00;
  uv_loop_t *loop;
  char *pcVar3;
  long *extraout_RDX;
  long *__n;
  uv_pipe_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t uStack_70;
  undefined8 uStack_60;
  long lStack_28;
  code *pcStack_20;
  ulong local_10;
  uv_close_cb local_8;
  
  pcStack_20 = (code *)0x1a6135;
  run_ipc_test("ipc_helper_listen_after_write",on_read);
  local_8 = (uv_close_cb)0x1;
  local_10 = (ulong)local_conn_accepted;
  if (local_10 == 1) {
    local_8 = (uv_close_cb)0x1;
    local_10 = (ulong)remote_conn_accepted;
    if (local_10 != 1) goto LAB_001a61cf;
    local_8 = (uv_close_cb)0x1;
    local_10 = (ulong)read_cb_called;
    if (local_10 != 1) goto LAB_001a61de;
    local_8 = (uv_close_cb)0x1;
    local_10 = (ulong)exit_cb_called;
    if (local_10 == 1) {
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x1a61cf;
    run_test_ipc_listen_after_write_cold_1();
LAB_001a61cf:
    pcStack_20 = (code *)0x1a61de;
    run_test_ipc_listen_after_write_cold_2();
LAB_001a61de:
    pcStack_20 = (code *)0x1a61ed;
    run_test_ipc_listen_after_write_cold_3();
  }
  pcStack_20 = run_test_ipc_tcp_connection;
  run_test_ipc_listen_after_write_cold_4();
  run_ipc_test("ipc_helper_tcp_connection",on_read_connection);
  pcStack_20 = (code *)0x1;
  lStack_28 = (long)read_cb_called;
  if (lStack_28 == 1) {
    pcStack_20 = (code *)0x1;
    lStack_28 = (long)tcp_write_cb_called;
    if (lStack_28 != 1) goto LAB_001a62ad;
    pcStack_20 = (code *)0x1;
    lStack_28 = (long)tcp_read_cb_called;
    if (lStack_28 != 1) goto LAB_001a62bc;
    pcStack_20 = (code *)0x1;
    lStack_28 = (long)exit_cb_called;
    if (lStack_28 == 1) {
      return 0;
    }
  }
  else {
    run_test_ipc_tcp_connection_cold_1();
LAB_001a62ad:
    run_test_ipc_tcp_connection_cold_2();
LAB_001a62bc:
    run_test_ipc_tcp_connection_cold_3();
  }
  handle = (uv_pipe_t *)&stack0xffffffffffffffe0;
  __n = &lStack_28;
  run_test_ipc_tcp_connection_cold_4();
  if (__n == (long *)0x0) {
LAB_001a6301:
    free((void *)*extraout_RDX);
    return extraout_EAX;
  }
  if ((long)__n < 0) {
    if (__n != (long *)0xfffffffffffff001) {
      pcVar3 = uv_strerror((int)__n);
      printf("error recving on channel: %s\n",pcVar3);
      abort();
    }
    goto LAB_001a6301;
  }
  fprintf(_stderr,"got %d bytes\n",(ulong)__n & 0xffffffff);
  uStack_70.base = (char *)0x1;
  iVar1 = uv_pipe_pending_count(handle);
  if ((long *)uStack_70.base == (long *)(long)iVar1) {
    uVar2 = uv_pipe_pending_type(handle);
    uStack_70.base = (char *)__n;
    if ((long)__n < 1) goto LAB_001a651e;
    if (*extraout_RDX == 0) goto LAB_001a652b;
    uStack_70.base = (char *)(ulong)uVar2;
    if ((long *)uStack_70.base == (long *)0x0) goto LAB_001a6530;
    read_cb_called = read_cb_called + 1;
    if ((long *)uStack_70.base != (long *)0xc) goto LAB_001a653d;
    loop = uv_default_loop();
    iVar1 = uv_tcp_init(loop,&tcp_connection);
    uStack_70.base = (char *)(long)iVar1;
    if ((long *)uStack_70.base != (long *)0x0) goto LAB_001a654a;
    iVar1 = uv_accept((uv_stream_t *)handle,(uv_stream_t *)&tcp_connection);
    uStack_70.base = (char *)(long)iVar1;
    if ((long *)uStack_70.base == (long *)0x0) {
      iVar1 = bcmp("hello\n",(void *)*extraout_RDX,(size_t)__n);
      if (iVar1 == 0) {
        uStack_70 = uv_buf_init("world\n",6);
        iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_connection,&uStack_70,1,on_tcp_write);
        uStack_60 = 0;
        if (iVar1 == 0) {
          iVar1 = uv_read_start((uv_stream_t *)&tcp_connection,on_read_alloc,on_tcp_read);
          uStack_60 = 0;
          if (iVar1 == 0) {
            free((void *)*extraout_RDX);
            return extraout_EAX_00;
          }
        }
        else {
          on_read_connection_cold_6();
        }
        on_read_connection_cold_7();
        run_ipc_test("ipc_helper_send_zero",on_read_send_zero);
        return 0;
      }
      goto LAB_001a6564;
    }
  }
  else {
    on_read_connection_cold_1();
LAB_001a651e:
    on_read_connection_cold_2();
LAB_001a652b:
    on_read_connection_cold_9();
LAB_001a6530:
    on_read_connection_cold_8();
LAB_001a653d:
    on_read_connection_cold_3();
LAB_001a654a:
    on_read_connection_cold_4();
  }
  on_read_connection_cold_5();
LAB_001a6564:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
          ,0x18a,"\"hello\\n\"");
  abort();
}

Assistant:

TEST_IMPL(ipc_listen_after_write) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_listen_after_write", on_read);
  ASSERT_EQ(1, local_conn_accepted);
  ASSERT_EQ(1, remote_conn_accepted);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, exit_cb_called);
  return r;
}